

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::ReadSymlink(string *newName,string *origName)

{
  char *pcVar1;
  ssize_t sVar2;
  uint uVar3;
  char buf [4097];
  char acStack_1028 [4104];
  
  sVar2 = readlink((newName->_M_dataplus)._M_p,acStack_1028,0x1000);
  uVar3 = (uint)sVar2;
  if (-1 < (int)uVar3) {
    acStack_1028[uVar3 & 0x7fffffff] = '\0';
    pcVar1 = (char *)origName->_M_string_length;
    strlen(acStack_1028);
    std::__cxx11::string::_M_replace((ulong)origName,0,pcVar1,(ulong)acStack_1028);
  }
  return -1 < (int)uVar3;
}

Assistant:

bool SystemTools::ReadSymlink(const kwsys_stl::string& newName,
                              kwsys_stl::string& origName)
{
  char buf[KWSYS_SYSTEMTOOLS_MAXPATH+1];
  int count =
    static_cast<int>(readlink(newName.c_str(), buf, KWSYS_SYSTEMTOOLS_MAXPATH));
  if(count >= 0)
    {
    // Add null-terminator.
    buf[count] = 0;
    origName = buf;
    return true;
    }
  else
    {
    return false;
    }
}